

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_hp_warn(char *name,wchar_t unused)

{
  byte bVar1;
  _Bool _Var2;
  uint8_t uVar3;
  uint in_EAX;
  char *str;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  char tmp [4];
  
  strnfmt(&stack0xffffffffffffffdc,4,"%i",(ulong)(player->opts).hitpoint_warn,in_R8,in_R9,
          (ulong)in_EAX);
  screen_save();
  prt("",L'\x13',L'\0');
  prt("Command: Hitpoint Warning",L'\x14',L'\0');
  prt("New hitpoint warning (0-9): ",L'\x15',L'\0');
  bVar1 = (player->opts).hitpoint_warn;
  str = format("Current hitpoint warning: %d (%d%%)",(ulong)bVar1,
               (ulong)(((uint)bVar1 + (uint)bVar1) * 5));
  prt(str,L'\x16',L'\0');
  prt("",L'\x17',L'\0');
  _Var2 = askfor_aux(&stack0xffffffffffffffdc,4,askfor_aux_numbers);
  if (_Var2) {
    uVar4 = strtoul(&stack0xffffffffffffffdc,(char **)0x0,0);
    uVar3 = (uint8_t)uVar4;
    if (9 < ((uint)uVar4 & 0xfe)) {
      uVar3 = '\0';
    }
    (player->opts).hitpoint_warn = uVar3;
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_hp_warn(const char *name, int unused)
{
	bool res;
	char tmp[4] = "";
	uint8_t warn;

	strnfmt(tmp, sizeof(tmp), "%i", player->opts.hitpoint_warn);

	screen_save();

	/* Prompt */
	prt("", 19, 0);
	prt("Command: Hitpoint Warning", 20, 0);
	prt("New hitpoint warning (0-9): ", 21, 0);
	prt(format("Current hitpoint warning: %d (%d%%)",
		player->opts.hitpoint_warn, player->opts.hitpoint_warn * 10),
		22, 0);
	prt("", 23, 0);

	/* Ask the user for a string */
	res = askfor_aux(tmp, sizeof(tmp), askfor_aux_numbers);

	/* Process input */
	if (res) {
		warn = (uint8_t) strtoul(tmp, NULL, 0);
		
		/* Reset nonsensical warnings */
		if (warn > 9)
			warn = 0;

		player->opts.hitpoint_warn = warn;
	}

	screen_load();
}